

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptArguments
          (HlslGrammar *this,TFunction *function,TIntermTyped **arguments)

{
  bool bVar1;
  TIntermTyped *local_30;
  TIntermTyped *arg;
  TIntermTyped **arguments_local;
  TFunction *function_local;
  HlslGrammar *this_local;
  
  arg = (TIntermTyped *)arguments;
  arguments_local = (TIntermTyped **)function;
  function_local = (TFunction *)this;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      do {
        bVar1 = acceptAssignmentExpression(this,&local_30);
        if (!bVar1) {
          return false;
        }
        HlslParseContext::handleFunctionArgument
                  (this->parseContext,(TFunction *)arguments_local,(TIntermTyped **)arg,local_30);
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
      } while (bVar1);
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        expected(this,")");
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptArguments(TFunction* function, TIntermTyped*& arguments)
{
    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        return false;

    // RIGHT_PAREN
    if (acceptTokenClass(EHTokRightParen))
        return true;

    // must now be at least one expression...
    do {
        // expression
        TIntermTyped* arg;
        if (! acceptAssignmentExpression(arg))
            return false;

        // hook it up
        parseContext.handleFunctionArgument(function, arguments, arg);

        // COMMA
        if (! acceptTokenClass(EHTokComma))
            break;
    } while (true);

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen)) {
        expected(")");
        return false;
    }

    return true;
}